

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

int __thiscall
icu_63::RuleChain::select
          (RuleChain *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  char cVar1;
  UBool UVar2;
  undefined4 in_register_00000034;
  long lVar3;
  ConstChar16Ptr local_30 [3];
  
  lVar3 = CONCAT44(in_register_00000034,__nfds);
  cVar1 = (**(code **)(__readfds->fds_bits[0] + 0x18))(__readfds);
  if (cVar1 == '\0') {
    cVar1 = (**(code **)(__readfds->fds_bits[0] + 0x20))(__readfds);
    if (cVar1 == '\0') {
      for (; lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x48)) {
        UVar2 = OrConstraint::isFulfilled
                          (*(OrConstraint **)(lVar3 + 0x50),(IFixedDecimal *)__readfds);
        if (UVar2 != '\0') {
          UnicodeString::UnicodeString((UnicodeString *)this,(UnicodeString *)(lVar3 + 8));
          goto LAB_00262d1f;
        }
      }
    }
  }
  local_30[0].p_ = (char16_t *)PLURAL_KEYWORD_OTHER;
  UnicodeString::UnicodeString((UnicodeString *)this,'\x01',local_30,5);
LAB_00262d1f:
  return (int)this;
}

Assistant:

UnicodeString
RuleChain::select(const IFixedDecimal &number) const {
    if (!number.isNaN() && !number.isInfinite()) {
        for (const RuleChain *rules = this; rules != nullptr; rules = rules->fNext) {
             if (rules->ruleHeader->isFulfilled(number)) {
                 return rules->fKeyword;
             }
        }
    }
    return UnicodeString(TRUE, PLURAL_KEYWORD_OTHER, 5);
}